

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::BufferGLImpl::MapRange
          (BufferGLImpl *this,GLContextState *CtxState,MAP_TYPE MapType,Uint32 MapFlags,
          Uint64 Offset,Uint64 Length,PVoid *pMappedData)

{
  GLenum GVar1;
  PFNGLMAPBUFFERRANGEPROC p_Var2;
  Char *pCVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  undefined1 local_a8 [8];
  string msg_2;
  string msg_1;
  GLenum err;
  undefined1 local_58 [8];
  string msg;
  GLbitfield Access;
  bool ResetVAO;
  Uint64 Length_local;
  Uint64 Offset_local;
  Uint32 MapFlags_local;
  MAP_TYPE MapType_local;
  GLContextState *CtxState_local;
  BufferGLImpl *this_local;
  
  _Access = Length;
  Length_local = Offset;
  Offset_local._0_4_ = MapFlags;
  Offset_local._7_1_ = MapType;
  _MapFlags_local = CtxState;
  CtxState_local = (GLContextState *)this;
  BufferMemoryBarrier(this,MEMORY_BARRIER_CLIENT_MAPPED_BUFFER,CtxState);
  msg.field_2._M_local_buf[0xf] = '\x01';
  GLContextState::BindBuffer(_MapFlags_local,this->m_BindTarget,&this->m_GlBuffer,true);
  msg.field_2._8_4_ = 0;
  if (Offset_local._7_1_ == MAP_READ) {
    msg.field_2._8_4_ = 1;
  }
  else if (Offset_local._7_1_ == MAP_WRITE) {
    msg.field_2._8_4_ = 2;
    if (((Uint32)Offset_local & 2) != 0) {
      msg.field_2._8_4_ = 10;
    }
    if (((Uint32)Offset_local & 4) != 0) {
      msg.field_2._8_4_ = msg.field_2._8_4_ | 0x20;
    }
  }
  else if (Offset_local._7_1_ == MAP_READ_WRITE) {
    msg.field_2._8_4_ = 3;
  }
  else {
    FormatString<char[17]>((string *)local_58,(char (*) [17])"Unknown map type");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"MapRange",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0x172);
    std::__cxx11::string::~string((string *)local_58);
  }
  p_Var2 = __glewMapBufferRange;
  GVar1 = this->m_BindTarget;
  lVar4 = StaticCast<long,unsigned_long>(&Length_local);
  lVar5 = StaticCast<long,unsigned_long>((unsigned_long *)&Access);
  pvVar6 = (*p_Var2)(GVar1,lVar4,lVar5,msg.field_2._8_4_);
  *pMappedData = pvVar6;
  msg_1.field_2._8_4_ = glGetError();
  if (msg_1.field_2._8_4_ != 0) {
    LogError<false,char[26],char[17],unsigned_int>
              (false,"MapRange",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0x176,(char (*) [26])"glMapBufferRange() failed",(char (*) [17])"\nGL Error Code: ",
               (uint *)(msg_1.field_2._M_local_buf + 8));
    FormatString<char[6]>((string *)((long)&msg_2.field_2 + 8),(char (*) [6])0x4585f6);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"MapRange",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0x176);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (*pMappedData == (PVoid)0x0) {
    FormatString<char[11]>((string *)local_a8,(char (*) [11])"Map failed");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"MapRange",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,0x177);
    std::__cxx11::string::~string((string *)local_a8);
  }
  return;
}

Assistant:

void BufferGLImpl::MapRange(GLContextState& CtxState, MAP_TYPE MapType, Uint32 MapFlags, Uint64 Offset, Uint64 Length, PVoid& pMappedData)
{
    BufferMemoryBarrier(
        MEMORY_BARRIER_CLIENT_MAPPED_BUFFER, // Access by the client to persistent mapped regions of buffer
                                             // objects will reflect data written by shaders prior to the barrier.
                                             // Note that this may cause additional synchronization operations.
        CtxState);

    // We must unbind VAO because otherwise we will break the bindings
    constexpr bool ResetVAO = true;
    CtxState.BindBuffer(m_BindTarget, m_GlBuffer, ResetVAO);

    // !!!WARNING!!! GL_MAP_UNSYNCHRONIZED_BIT is not the same thing as MAP_FLAG_DO_NOT_WAIT.
    // If GL_MAP_UNSYNCHRONIZED_BIT flag is set, OpenGL will not attempt to synchronize operations
    // on the buffer. This does not mean that map will fail if the buffer still in use. It is thus
    // what WRITE_NO_OVERWRITE does

    GLbitfield Access = 0;
    switch (MapType)
    {
        case MAP_READ:
            Access |= GL_MAP_READ_BIT;
            break;

        case MAP_WRITE:
            Access |= GL_MAP_WRITE_BIT;

            if (MapFlags & MAP_FLAG_DISCARD)
            {
                // Use GL_MAP_INVALIDATE_BUFFER_BIT flag to discard previous buffer contents

                // If GL_MAP_INVALIDATE_BUFFER_BIT is specified, the entire contents of the buffer may
                // be discarded and considered invalid, regardless of the specified range. Any data
                // lying outside the mapped range of the buffer object becomes undefined, as does any
                // data within the range but not subsequently written by the application.This flag may
                // not be used with GL_MAP_READ_BIT.
                Access |= GL_MAP_INVALIDATE_BUFFER_BIT;
            }

            if (MapFlags & MAP_FLAG_NO_OVERWRITE)
            {
                // If GL_MAP_UNSYNCHRONIZED_BIT flag is set, OpenGL will not attempt to synchronize
                // operations on the buffer.
                Access |= GL_MAP_UNSYNCHRONIZED_BIT;
            }
            break;


        case MAP_READ_WRITE:
            Access |= GL_MAP_WRITE_BIT | GL_MAP_READ_BIT;
            break;


        default: UNEXPECTED("Unknown map type");
    }

    pMappedData = glMapBufferRange(m_BindTarget, StaticCast<GLintptr>(Offset), StaticCast<GLsizeiptr>(Length), Access);
    DEV_CHECK_GL_ERROR("glMapBufferRange() failed");
    VERIFY(pMappedData, "Map failed");
}